

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O0

QpSolverStatus __thiscall
Basis::activate(Basis *this,Settings *settings,HighsInt conid,BasisStatus newstatus,
               HighsInt nonactivetoremove,Pricing *pricing)

{
  bool bVar1;
  mapped_type *pmVar2;
  reference pvVar3;
  uint *puVar4;
  mapped_type in_ECX;
  uint in_EDX;
  key_type_conflict1 *in_RSI;
  map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_> *in_RDI
  ;
  int in_R8D;
  vector<int,_std::allocator<int>_> *in_R9;
  HighsInt rowtoremove;
  HighsInt in_stack_00000050;
  HighsInt in_stack_00000054;
  Settings *in_stack_00000058;
  Basis *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar6;
  map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
  *this_00;
  QpSolverStatus local_4;
  
  this_00 = in_RDI;
  bVar1 = contains<int>(in_R9,(int *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    printf("Degeneracy? constraint %d already in basis\n",(ulong)in_EDX);
    local_4 = DEGENERATE;
  }
  else {
    pmVar2 = std::
             map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
             ::operator[](this_00,in_RSI);
    *pmVar2 = kInactive;
    pmVar2 = std::
             map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
             ::operator[](this_00,in_RSI);
    *pmVar2 = in_ECX;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_RDI,
               (value_type_conflict2 *)CONCAT44(in_ECX,in_stack_ffffffffffffffb8));
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[0x32]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                        (long)in_R8D);
    iVar6 = *pvVar3;
    uVar5 = in_EDX;
    puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &in_RDI[0x30]._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (long)iVar6);
    *puVar4 = uVar5;
    remove<int>((vector<int,_std::allocator<int>_> *)this_00,in_RSI);
    updatebasis(in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000050,
                (Pricing *)this);
    if (*(int *)&in_RDI[0x2e]._M_t._M_impl != 0) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[0x32]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                          (long)in_R8D);
      *pvVar3 = -1;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[0x32]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                          (long)(int)in_EDX);
      *pvVar3 = iVar6;
    }
    local_4 = OK;
  }
  return local_4;
}

Assistant:

QpSolverStatus Basis::activate(const Settings& settings, HighsInt conid,
                               BasisStatus newstatus,
                               HighsInt nonactivetoremove, Pricing* pricing) {
  // printf("activ %" HIGHSINT_FORMAT "\n", conid);
  if (!contains(active_constraint_index, (HighsInt)conid)) {
    basisstatus[nonactivetoremove] = BasisStatus::kInactive;
    basisstatus[conid] = newstatus;
    active_constraint_index.push_back(conid);
  } else {
    printf("Degeneracy? constraint %" HIGHSINT_FORMAT " already in basis\n",
           conid);
    return QpSolverStatus::DEGENERATE;
  }

  // printf("drop %d\n", nonactivetoremove);
  // remove non-active row from basis
  HighsInt rowtoremove = constraintindexinbasisfactor[nonactivetoremove];

  baseindex[rowtoremove] = conid;
  remove(non_active_constraint_index, nonactivetoremove);
  updatebasis(settings, conid, nonactivetoremove, pricing);

  if (updatessinceinvert != 0) {
    constraintindexinbasisfactor[nonactivetoremove] = -1;
    constraintindexinbasisfactor[conid] = rowtoremove;
  }
  return QpSolverStatus::OK;
}